

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O0

void calc<float>(options2 *opt)

{
  fvar<float,_2UL> fVar1;
  fvar<float,_2UL> beta_00;
  fvar<float,_2UL> beta_01;
  fvar<float,_2UL> f_00;
  fvar<float,_2UL> f_01;
  fvar<float,_2UL> f_02;
  bool bVar2;
  _Setprecision _Var3;
  invalid_argument *piVar4;
  ostream *poVar5;
  ostream *poVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  root_type rVar10;
  float in_stack_00000044;
  float in_stack_00000048;
  array<float,_3UL> in_stack_0000005c;
  fvar<float,_2UL> f;
  autodiff_fvar<float,_2UL> beta;
  real_t t;
  real_t dT;
  real_t Tmax;
  real_t Tmin;
  real_t Jy;
  real_t Jx;
  char *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  float fVar11;
  undefined4 local_198;
  ostream *in_stack_fffffffffffffe70;
  float fVar12;
  float in_stack_fffffffffffffe90;
  undefined4 uVar13;
  float in_stack_fffffffffffffe94;
  undefined4 uVar14;
  undefined8 in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffea0;
  float local_34;
  float local_1c;
  float local_18;
  float local_14;
  
  fVar8 = convert<float>((string *)0x1202f0);
  fVar9 = convert<float>((string *)0x12030a);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe58);
  if (!bVar2) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            in_stack_fffffffffffffe58);
    if (!bVar2) {
      local_14 = convert<float>((string *)0x120392);
      local_18 = convert<float>((string *)0x1203ac);
      local_1c = convert<float>((string *)0x1203c9);
      goto LAB_001203d2;
    }
  }
  local_1c = ising::tc::square<float>(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90);
  local_18 = local_1c;
  local_14 = local_1c;
LAB_001203d2:
  if ((local_14 < 0.0) || (local_18 < 0.0)) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    uVar13 = SUB84(piVar4,0);
    std::invalid_argument::invalid_argument(piVar4,"Temperature should be positive");
    __cxa_throw(uVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (local_18 < local_14) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Tmax should be larger than Tmin");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (local_1c <= 0.0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    uVar13 = SUB84(piVar4,0);
    uVar14 = (undefined4)((ulong)piVar4 >> 0x20);
    std::invalid_argument::invalid_argument(piVar4,"dT should be positive");
    __cxa_throw(CONCAT44(uVar14,uVar13),&std::invalid_argument::typeinfo,
                std::invalid_argument::~invalid_argument);
  }
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::scientific);
  _Var3 = std::setprecision(6);
  poVar6 = std::operator<<(poVar5,_Var3);
  poVar6 = std::operator<<(poVar6,"# lattice: square\n");
  poVar6 = std::operator<<(poVar6,"# precision: ");
  pvVar7 = (void *)std::ostream::operator<<(poVar6,6);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar6,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n");
  for (local_34 = local_14; local_34 < local_1c * 0.0001 + local_18; local_34 = local_1c + local_34)
  {
    fVar11 = 1.0;
    boost::math::differentiation::autodiff_v1::make_fvar<float,_2UL>
              ((float *)CONCAT44(0x3f800000,in_stack_fffffffffffffe60));
    ising::free_energy::square::
    infinite<float,boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
              (in_stack_00000048,in_stack_00000044,(fvar<float,_2UL>)in_stack_0000005c._M_elems);
    poVar6 = std::operator<<((ostream *)&std::cout,"inf inf ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,fVar8);
    fVar12 = 4.48416e-44;
    poVar6 = std::operator<<(poVar6,' ');
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,fVar9);
    poVar6 = std::operator<<(poVar6,SUB41(fVar12,0));
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_34);
    poVar6 = std::operator<<(poVar6,SUB41(fVar12,0));
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,fVar11 / local_34);
    poVar6 = std::operator<<(poVar6,SUB41(fVar12,0));
    local_198 = SUB84(poVar6,0);
    fVar11 = (float)((ulong)poVar6 >> 0x20);
    f_00.v._M_elems[2] = in_stack_fffffffffffffe90;
    f_00.v._M_elems._0_8_ = poVar5;
    fVar1.v._M_elems._4_8_ = in_stack_fffffffffffffe70;
    fVar1.v._M_elems[0] = fVar11;
    rVar10 = ising::free_energy::
             free_energy<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                       (f_00,fVar1);
    poVar6 = (ostream *)std::ostream::operator<<((void *)CONCAT44(fVar11,local_198),rVar10);
    in_stack_fffffffffffffe70 = std::operator<<(poVar6,SUB41(fVar12,0));
    f_01.v._M_elems[2] = in_stack_fffffffffffffe90;
    f_01.v._M_elems._0_8_ = poVar5;
    beta_00.v._M_elems._4_8_ = in_stack_fffffffffffffe70;
    beta_00.v._M_elems[0] = fVar11;
    rVar10 = ising::free_energy::
             energy<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                       (f_01,beta_00);
    poVar6 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe70,rVar10);
    poVar6 = std::operator<<(poVar6,SUB41(fVar12,0));
    f_02.v._M_elems[2] = in_stack_fffffffffffffea0;
    f_02.v._M_elems[0] = (float)(int)in_stack_fffffffffffffe98;
    f_02.v._M_elems[1] = (float)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    beta_01.v._M_elems._4_8_ = poVar6;
    beta_01.v._M_elems[0] = fVar12;
    rVar10 = ising::free_energy::
             specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                       (f_02,beta_01);
    pvVar7 = (void *)std::ostream::operator<<(poVar6,rVar10);
    std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void calc(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << (1 / t)
              << ' ' << free_energy(f, beta) << ' ' << energy(f, beta) << ' '
              << specific_heat(f, beta) << std::endl;
  }
}